

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::CSVReaderOptions(CSVReaderOptions *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_> __l_01;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_bool>_> __l_02;
  allocator_type local_20a;
  less<duckdb::LogicalTypeId> local_209 [9];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_200;
  LogicalType local_1f8 [24];
  LogicalType local_1e0 [24];
  undefined1 local_1c8 [48];
  LogicalType local_198 [24];
  LogicalType local_180 [8];
  Value local_178 [16];
  LogicalType local_168 [24];
  LogicalType local_150 [24];
  LogicalType local_138 [24];
  LogicalType local_120 [24];
  LogicalType local_108 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator local_b0 [64];
  allocator_type local_70 [64];
  
  DialectOptions::DialectOptions(&this->dialect_options);
  (this->ignore_errors).set_by_user = false;
  (this->ignore_errors).value = false;
  (this->store_rejects).set_by_user = false;
  (this->store_rejects).value = false;
  std::__cxx11::string::string((string *)&local_d0,"reject_errors",(allocator *)local_1c8);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption(&this->rejects_table_name,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"reject_scans",(allocator *)local_1c8);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption(&this->rejects_scan_name,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  this->rejects_limit = 0;
  this->buffer_sample_size = 0x19000;
  std::__cxx11::string::string((string *)local_1c8,anon_var_dwarf_889e57 + 9,local_b0);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->null_str).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,__l,local_70);
  local_200 = &this->null_str;
  std::__cxx11::string::~string((string *)local_1c8);
  this->compression = AUTO_DETECT;
  this->allow_quoted_nulls = true;
  this->comment = '\0';
  (this->sql_types_per_column)._M_h._M_buckets = &(this->sql_types_per_column)._M_h._M_single_bucket
  ;
  (this->sql_types_per_column)._M_h._M_bucket_count = 1;
  (this->sql_types_per_column)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sql_types_per_column)._M_h._M_element_count = 0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sql_types_per_column)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->columns_set = false;
  duckdb::LogicalType::LogicalType((LogicalType *)local_1c8,VARCHAR);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_1c8 + 0x18),DOUBLE);
  duckdb::LogicalType::LogicalType(local_198,BIGINT);
  duckdb::LogicalType::LogicalType(local_180,TIMESTAMP_TZ);
  duckdb::LogicalType::LogicalType(local_168,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_150,DATE);
  duckdb::LogicalType::LogicalType(local_138,TIME);
  duckdb::LogicalType::LogicalType(local_120,BOOLEAN);
  duckdb::LogicalType::LogicalType(local_108,SQLNULL);
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_1c8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&(this->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l_00,
             (allocator_type *)local_b0);
  lVar2 = 0xc0;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_1c8 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  (this->sniffer_user_mismatch_error)._M_dataplus._M_p =
       (pointer)&(this->sniffer_user_mismatch_error).field_2;
  (this->sniffer_user_mismatch_error)._M_string_length = 0;
  (this->sniffer_user_mismatch_error).field_2._M_local_buf[0] = '\0';
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->maximum_line_size).set_by_user = false;
  (this->maximum_line_size).value = 2000000;
  this->normalize_names = false;
  (this->force_not_null_names)._M_h._M_buckets = &(this->force_not_null_names)._M_h._M_single_bucket
  ;
  (this->force_not_null_names)._M_h._M_bucket_count = 1;
  (this->force_not_null_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->force_not_null_names)._M_h._M_element_count = 0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->force_not_null_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->force_not_null_names)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)
   ((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 4) = 0;
  this->sample_size_chunks = 10;
  this->all_varchar = false;
  this->auto_detect = true;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  (this->buffer_size_option).set_by_user = false;
  (this->buffer_size_option).value = 32000000;
  std::__cxx11::string::string((string *)&this->decimal_separator,".",(allocator *)local_1c8);
  this->null_padding = false;
  this->parallel = true;
  std::__cxx11::string::string((string *)&this->encoding,"utf-8",(allocator *)local_1c8);
  p_Var1 = &(this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->suffix)._M_dataplus._M_p = (pointer)&(this->suffix).field_2;
  (this->suffix)._M_string_length = 0;
  (this->suffix).field_2._M_local_buf[0] = '\0';
  (this->write_newline)._M_dataplus._M_p = (pointer)&(this->write_newline).field_2;
  (this->write_newline)._M_string_length = 0;
  (this->write_newline).field_2._M_local_buf[0] = '\0';
  duckdb::LogicalType::LogicalType(local_1e0,SQLNULL);
  duckdb::Value::Value((Value *)local_b0,local_1e0);
  local_1c8[0] = DATE;
  duckdb::Value::Value((Value *)(local_1c8 + 8),(Value *)local_b0);
  duckdb::LogicalType::LogicalType(local_1f8,SQLNULL);
  duckdb::Value::Value((Value *)local_70,local_1f8);
  local_180[0] = (LogicalType)0x13;
  duckdb::Value::Value(local_178,(Value *)local_70);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1c8;
  std::
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::map(&this->write_date_format,__l_01,local_209,&local_20a);
  lVar2 = 0x50;
  do {
    duckdb::Value::~Value((Value *)(local_1c8 + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x40);
  duckdb::Value::~Value((Value *)local_70);
  duckdb::LogicalType::~LogicalType(local_1f8);
  duckdb::Value::~Value((Value *)local_b0);
  duckdb::LogicalType::~LogicalType(local_1e0);
  local_1c8._0_4_ = 0x13000f;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1c8;
  std::
  map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::map(&this->has_format,__l_02,(less<duckdb::LogicalTypeId> *)local_b0,(allocator_type *)local_70)
  ;
  this->multi_file_reader = false;
  return;
}

Assistant:

CSVReaderOptions() {
	}